

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O2

DWORD GetLongPathNameW(LPCWSTR lpszShortPath,LPWSTR lpszLongPath,DWORD cchBuffer)

{
  DWORD DVar1;
  size_t sVar2;
  uint uVar3;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpszShortPath == (LPCWSTR)0x0) {
      SetLastError(0x57);
    }
    else {
      DVar1 = GetFileAttributesW(lpszShortPath);
      if (DVar1 != 0xffffffff) {
        sVar2 = PAL_wcslen(lpszShortPath);
        DVar1 = (DWORD)sVar2;
        uVar3 = DVar1 + 1;
        if (lpszLongPath != (LPWSTR)0x0) {
          if (cchBuffer < uVar3) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012703e;
            SetLastError(0x7a);
          }
          else {
            uVar3 = DVar1;
            if (lpszShortPath != lpszLongPath) {
              PAL_wcsncpy(lpszLongPath,lpszShortPath,(ulong)cchBuffer);
            }
          }
        }
        if (PAL_InitializeChakraCoreCalled != false) {
          return uVar3;
        }
        goto LAB_0012703e;
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return 0;
    }
  }
LAB_0012703e:
  abort();
}

Assistant:

DWORD
PALAPI
GetLongPathNameW(
		 IN LPCWSTR lpszShortPath,
         OUT LPWSTR lpszLongPath,
  		 IN DWORD cchBuffer)
{
    DWORD dwPathLen = 0;

    PERF_ENTRY(GetLongPathNameW);
    ENTRY("GetLongPathNameW(lpszShortPath=%p (%S), lpszLongPath=%p (%S), "
          "cchBuffer=%d\n", lpszShortPath, lpszShortPath, lpszLongPath, lpszLongPath, cchBuffer);

    if ( !lpszShortPath )
    {
        ERROR( "lpszShortPath was not a valid pointer.\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        LOGEXIT("GetLongPathNameW returns DWORD 0\n");
        PERF_EXIT(GetLongPathNameW);
        return 0;
    }
    else if (INVALID_FILE_ATTRIBUTES == GetFileAttributesW( lpszShortPath ))
    {
        // last error has been set by GetFileAttributes
        ERROR( "lpszShortPath does not exist.\n" );
        LOGEXIT("GetLongPathNameW returns DWORD 0\n");
        PERF_EXIT(GetLongPathNameW);
        return 0;
    }

    /* all lengths are # of TCHAR characters */
    /* "required size" includes space for the terminating null character */
    dwPathLen = PAL_wcslen(lpszShortPath)+1;

    /* lpszLongPath == 0 means caller is asking only for size */
    if ( lpszLongPath )
    {
        if ( dwPathLen > cchBuffer )
        {
            ERROR("Buffer is too small, need %d characters\n", dwPathLen);
            SetLastError( ERROR_INSUFFICIENT_BUFFER );
        } else
        {
            if ( lpszShortPath != lpszLongPath )
            {
                // Note: MSDN doesn't specify the behavior of GetLongPathName API
                //       if the buffers are overlap.
                PAL_wcsncpy( lpszLongPath, lpszShortPath, cchBuffer );
            }

            /* actual size not including terminating null is returned */
            dwPathLen--;
        }
    }

    LOGEXIT("GetLongPathNameW returns DWORD %u\n", dwPathLen);
    PERF_EXIT(GetLongPathNameW);
    return dwPathLen;
}